

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void tge_setup(tgestate_t *state)

{
  undefined8 in_RDI;
  attribute_t in_stack_0000000f;
  tgestate_t *in_stack_00000010;
  
  wipe_full_screen_and_attributes((tgestate_t *)0x11377e);
  set_morale_flag_screen_attributes(in_stack_00000010,in_stack_0000000f);
  set_menu_item_attributes(state,(int)((ulong)in_RDI >> 0x20),(attribute_t)((ulong)in_RDI >> 0x18));
  plot_statics_and_menu_text(in_stack_00000010);
  plot_score(in_stack_00000010);
  return;
}

Assistant:

TGE_API void tge_setup(tgestate_t *state)
{
  assert(state != NULL);

  wipe_full_screen_and_attributes(state);
  set_morale_flag_screen_attributes(state, attribute_BRIGHT_GREEN_OVER_BLACK);
  /* Conv: The original code passes in 68, not zero, as it uses a register
   * left over from a previous call to set_morale_flag_screen_attributes(). */
  set_menu_item_attributes(state, 0, attribute_BRIGHT_YELLOW_OVER_BLACK);
  plot_statics_and_menu_text(state);

  plot_score(state);
}